

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

bool __thiscall
QPDFNumberTreeObjectHelper::hasIndex(QPDFNumberTreeObjectHelper *this,numtree_number idx)

{
  bool bVar1;
  iterator local_78;
  undefined1 local_48 [8];
  iterator i;
  numtree_number idx_local;
  QPDFNumberTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)idx;
  find((iterator *)local_48,this,idx,false);
  end(&local_78,this);
  bVar1 = iterator::operator!=((iterator *)local_48,&local_78);
  iterator::~iterator(&local_78);
  iterator::~iterator((iterator *)local_48);
  return bVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::hasIndex(numtree_number idx)
{
    auto i = find(idx);
    return (i != this->end());
}